

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::anon_unknown_3::PLYValueList::~PLYValueList(PLYValueList *this)

{
  PLYValue *pPVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  ulong uVar4;
  
  (this->super_PLYValue)._vptr_PLYValue = (_func_int **)&PTR__PLYValueList_001306c0;
  if (this->size != (PLYValue *)0x0) {
    (*this->size->_vptr_PLYValue[1])();
  }
  ppPVar3 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar2 != ppPVar3) {
    uVar4 = 0;
    do {
      pPVar1 = ppPVar3[uVar4];
      if (pPVar1 != (PLYValue *)0x0) {
        (*pPVar1->_vptr_PLYValue[1])(pPVar1);
        ppPVar3 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar2 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppPVar2 - (long)ppPVar3 >> 3));
  }
  if (ppPVar3 != (pointer)0x0) {
    operator_delete(ppPVar3);
    return;
  }
  return;
}

Assistant:

~PLYValueList()
    {
      delete size;

      for (size_t i=0; i<list.size(); i++)
      {
        delete list[i];
      }
    }